

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_finish_entry(archive_write *a)

{
  uint16_t uVar1;
  uchar *__dest;
  archive *in_RDI;
  uchar *zd;
  uchar *z;
  uchar zip64 [32];
  char d [24];
  size_t remainder;
  int ret;
  zip_conflict *zip;
  void *in_stack_ffffffffffffff58;
  archive_write *in_stack_ffffffffffffff60;
  uint32_t uVar2;
  zip_conflict *in_stack_ffffffffffffff68;
  uint32_t local_88;
  undefined1 *local_70;
  undefined4 local_68;
  undefined1 auStack_64 [8];
  undefined1 auStack_5c [20];
  undefined4 local_48;
  undefined1 auStack_44 [4];
  undefined1 auStack_40 [4];
  undefined1 auStack_3c [20];
  long local_28;
  int local_1c;
  long *local_18;
  archive *local_10;
  int local_4;
  
  local_18 = *(long **)&in_RDI[1].current_codepage;
  local_10 = in_RDI;
  if (*(int *)((long)local_18 + 0x3c) == 8) {
    while (local_1c = deflate(local_18 + 0x16,4), local_1c != -2) {
      local_28 = local_18[0x24] - (ulong)*(uint *)(local_18 + 0x1a);
      local_1c = __archive_write_output
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x1ab040);
      if (local_1c != 0) {
        return local_1c;
      }
      local_18[3] = local_28 + local_18[3];
      local_18[0x11] = local_28 + local_18[0x11];
      local_18[0x19] = local_18[0x25];
      if ((int)local_18[0x1a] != 0) {
        deflateEnd(local_18 + 0x16);
        goto LAB_001ab103;
      }
      *(int *)(local_18 + 0x1a) = (int)local_18[0x24];
      local_1c = 0;
    }
    local_4 = -0x1e;
  }
  else {
LAB_001ab103:
    if ((*(uint *)(local_18 + 8) & 8) != 0) {
      local_48 = 0x8074b50;
      archive_le32enc(auStack_44,*(uint32_t *)(local_18 + 7));
      if (*(int *)((long)local_18 + 0x44) == 0) {
        archive_le32enc(auStack_40,(uint32_t)local_18[3]);
        archive_le32enc(auStack_3c,(uint32_t)local_18[4]);
        local_1c = __archive_write_output
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x1ab208);
        local_18[0x11] = local_18[0x11] + 0x10;
      }
      else {
        archive_le64enc(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58);
        archive_le64enc(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58);
        local_1c = __archive_write_output
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x1ab196);
        local_18[0x11] = local_18[0x11] + 0x18;
      }
      if (local_1c != 0) {
        return -0x1e;
      }
    }
    if (((0xffffffff < local_18[3]) || (0xffffffff < local_18[4])) || (0xffffffff < *local_18)) {
      local_68 = 1;
      local_70 = auStack_64;
      if (0xfffffffe < local_18[4]) {
        archive_le64enc(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58);
        local_70 = auStack_5c;
      }
      if (0xfffffffe < local_18[3]) {
        archive_le64enc(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58);
        local_70 = local_70 + 8;
      }
      if (0xfffffffe < *local_18) {
        archive_le64enc(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58);
        local_70 = local_70 + 8;
      }
      archive_le16enc((void *)((long)&local_68 + 2),(short)local_70 - ((short)&local_68 + 4));
      __dest = cd_alloc(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
      if (__dest == (uchar *)0x0) {
        archive_set_error(local_10,0xc,"Can\'t allocate zip data");
        return -0x1e;
      }
      memcpy(__dest,&local_68,(long)local_70 - (long)&local_68);
      uVar1 = archive_le16dec((void *)(local_18[10] + 6));
      if (uVar1 < 0x2d) {
        archive_le16enc((void *)(local_18[10] + 6),0x2d);
      }
    }
    archive_le32enc((void *)(local_18[10] + 0x10),*(uint32_t *)(local_18 + 7));
    if (local_18[3] < 0x100000000) {
      local_88 = (uint32_t)local_18[3];
    }
    else {
      local_88 = 0xffffffff;
    }
    archive_le32enc((void *)(local_18[10] + 0x14),local_88);
    if (local_18[4] < 0x100000000) {
      uVar2 = (uint32_t)local_18[4];
    }
    else {
      uVar2 = 0xffffffff;
    }
    archive_le32enc((void *)(local_18[10] + 0x18),uVar2);
    archive_le16enc((void *)(local_18[10] + 0x1e),(short)local_18[0xf] - (short)local_18[0xb]);
    if (*local_18 < 0x100000000) {
      uVar2 = (uint32_t)*local_18;
    }
    else {
      uVar2 = 0xffffffff;
    }
    archive_le32enc((void *)(local_18[10] + 0x2a),uVar2);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;
			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8, (uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16, (uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8, (uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12, (uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > 0xffffffffLL
	    || zip->entry_uncompressed_written > 0xffffffffLL
	    || zip->entry_offset > 0xffffffffLL) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, z - (zip64 + 4));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
	    zipmin(zip->entry_compressed_written, 0xffffffffLL));
	archive_le32enc(zip->file_header + 24,
	    zipmin(zip->entry_uncompressed_written, 0xffffffffLL));
	archive_le16enc(zip->file_header + 30,
	    zip->central_directory_bytes - zip->file_header_extra_offset);
	archive_le32enc(zip->file_header + 42,
	    zipmin(zip->entry_offset, 0xffffffffLL));

	return (ARCHIVE_OK);
}